

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::getp_splice(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  vm_val_t *val;
  
  if (oargc == (uint *)0x0) {
    uVar10 = 0xfffffffe;
  }
  else {
    uVar10 = (ulong)(*oargc - 2);
  }
  if (getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_splice();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,oargc,&getp_splice::desc);
  if (iVar5 != 0) {
    return 1;
  }
  uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  iVar6 = CVmBif::pop_int_val();
  iVar5 = 0;
  if (iVar6 < 1) {
    iVar5 = uVar1 + 1;
  }
  if (0 < iVar5 + iVar6) {
    iVar6 = iVar6 + iVar5 + -1;
    iVar5 = (uint)uVar1 - iVar6;
    if (iVar6 <= (int)(uint)uVar1) {
      iVar7 = CVmBif::pop_int_val();
      val = sp_;
      if (iVar7 < iVar5) {
        iVar5 = iVar7;
      }
      retval->typ = VM_OBJ;
      (retval->val).obj = self;
      pvVar4 = sp_;
      uVar3 = *(undefined4 *)&retval->field_0x4;
      aVar2 = retval->val;
      sp_ = sp_ + 1;
      pvVar4->typ = retval->typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar3;
      pvVar4->val = aVar2;
      uVar9 = (uint)uVar10;
      if (iVar5 - uVar9 == 0 || iVar5 < (int)uVar9) {
        if (iVar5 < (int)uVar9) {
          insert_elements_undo(this,self,iVar5 + iVar6,uVar9 - iVar5);
        }
      }
      else {
        remove_elements_undo(this,self,(long)(int)(iVar6 + uVar9),(long)(int)(iVar5 - uVar9));
      }
      if (0 < (int)uVar9) {
        lVar8 = (long)iVar6 * 5 + 4;
        uVar11 = 0;
        do {
          val = val + -1;
          if (uVar11 < uVar1) {
            set_element_undo(this,self,uVar11 + (long)iVar6,val);
          }
          else {
            vmb_put_dh((this->super_CVmObjCollection).super_CVmObject.ext_ + lVar8,val);
          }
          uVar11 = uVar11 + 1;
          lVar8 = lVar8 + 5;
        } while (uVar10 != uVar11);
      }
      sp_ = sp_ + (int)~uVar9;
      return 1;
    }
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjVector::getp_splice(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the current vector size */
    int old_cnt = get_element_count();

    /* get the starting index, and adjust a zero or negative index */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    if (start_idx <= 0)
        start_idx += old_cnt + 1;

    /* adjust to a zero-based starting index */
    --start_idx;

    /* make sure the starting index is in range */
    if (start_idx < 0 || start_idx > old_cnt)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);;

    /* get the deletion count */
    int del_cnt = CVmBif::pop_int_val(vmg0_);

    /* adjust the deletion count to the number of elements remaining */
    if (del_cnt > old_cnt - start_idx)
        del_cnt = old_cnt - start_idx;

    /* get a pointer to the first inserted item, and the number of items */
    vm_val_t *ins = G_stk->get(0);
    int ins_cnt = argc - 2;

    /* the result object is 'self'; push self for gc protection */
    retval->set_obj(self);
    G_stk->push(retval);

    /* 
     *   If we're doing a net deletion, contract the vector.  If we're doing
     *   a net expansion, expand it. 
     */
    if (del_cnt > ins_cnt)
    {
        /* net deletion - remove the excess of deletions over insertions */
        remove_elements_undo(
            vmg_ self, start_idx + ins_cnt, del_cnt - ins_cnt);
    }
    else if (del_cnt < ins_cnt)
    {
        /* net insertion - add room for the excess inserted items */
        insert_elements_undo(
            vmg_ self, start_idx + del_cnt, ins_cnt - del_cnt);
    }

    /* set the new elements */
    for (int i = 0 ; i < ins_cnt ; ++i, --ins)
    {
        /* 
         *   If this element is within the old vector's size range, save
         *   undo, since we're overwriting a pre-existing element.  If it's
         *   beyond the end of the old vector, there's no need to keep undo
         *   since the overall undo operation will simply shrink the vector
         *   to eliminate the slot. 
         */
        if (i < old_cnt)
            set_element_undo(vmg_ self, start_idx + i, ins);
        else
            set_element(start_idx + i, ins);
    }

    /* discard the arguments and gc protection */
    G_stk->discard(ins_cnt + 1);

    /* handled */
    return TRUE;
}